

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.h
# Opt level: O2

void __thiscall bsplib::Rdma::ActionBuf::ActionBuf(ActionBuf *this,int nprocs)

{
  allocator_type local_1a;
  allocator_type local_19;
  
  (this->m_actions).super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_actions).super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_actions).super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->m_counts,(long)nprocs,&local_19);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->m_get_buffer_offset,(long)nprocs,&local_1a);
  return;
}

Assistant:

ActionBuf( int nprocs )
            : m_actions()
            , m_counts( nprocs )
            , m_get_buffer_offset( nprocs )
        {}